

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.h
# Opt level: O1

void __thiscall pbrt::syntactic::Token::~Token(Token *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  pcVar2 = (this->text)._M_dataplus._M_p;
  paVar1 = &(this->text).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  this_00 = (this->loc).file.super___shared_ptr<pbrt::syntactic::File,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  return;
}

Assistant:

struct PBRT_PARSER_INTERFACE Token {
      typedef enum { TOKEN_TYPE_STRING, TOKEN_TYPE_LITERAL, TOKEN_TYPE_SPECIAL, TOKEN_TYPE_NONE } Type;

      //! constructor
      Token() : loc{}, type{TOKEN_TYPE_NONE}, text{} {}
      Token(const Loc &loc, const Type type, const std::string& text) : loc{loc}, type{type}, text{text} { }
      Token(const Token &other) = default;
      Token(Token &&) = default;

      //! assignment
      Token& operator=(const Token &other) = default;
      Token& operator=(Token &&) = default;

      //! valid token
      explicit operator bool() { return type != TOKEN_TYPE_NONE; }
    
      //! pretty-print
      std::string toString() const { return loc.toString() + ": '" + text + "'"; }
      
      Loc         loc = {};
      Type        type = TOKEN_TYPE_NONE;
      std::string text = "";
    }